

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O2

ExceptionInfoResponse * __thiscall
cmDebugger::cmDebuggerExceptionManager::HandleExceptionInfoRequest
          (ExceptionInfoResponse *__return_storage_ptr__,cmDebuggerExceptionManager *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->Mutex);
  dap::ExceptionInfoResponse::ExceptionInfoResponse(__return_storage_ptr__);
  if ((this->TheException).super__Optional_base<cmDebugger::cmDebuggerException,_false,_false>.
      _M_payload.super__Optional_payload<cmDebugger::cmDebuggerException,_true,_false,_false>.
      super__Optional_payload_base<cmDebugger::cmDebuggerException>._M_engaged == true) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->exceptionId);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    dap::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&__return_storage_ptr__->description,
               &(this->TheException).
                super__Optional_base<cmDebugger::cmDebuggerException,_false,_false>._M_payload.
                super__Optional_payload<cmDebugger::cmDebuggerException,_true,_false,_false>.
                super__Optional_payload_base<cmDebugger::cmDebuggerException>._M_payload._M_value.
                Description);
    std::_Optional_payload_base<cmDebugger::cmDebuggerException>::_M_reset
              ((_Optional_payload_base<cmDebugger::cmDebuggerException> *)&this->TheException);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return __return_storage_ptr__;
}

Assistant:

dap::ExceptionInfoResponse
cmDebuggerExceptionManager::HandleExceptionInfoRequest()
{
  std::unique_lock<std::mutex> lock(Mutex);

  dap::ExceptionInfoResponse response;
  if (TheException.has_value()) {
    response.exceptionId = TheException->Id;
    response.breakMode = "always";
    response.description = TheException->Description;
    TheException = cm::nullopt;
  }
  return response;
}